

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.c
# Opt level: O2

void expire_timer_context(void *ctx)

{
  init_timers();
  del234(timer_contexts,ctx);
  return;
}

Assistant:

void expire_timer_context(void *ctx)
{
    init_timers();

    /*
     * We don't bother to check the return value; if the context
     * already wasn't in the tree (presumably because no timers
     * ever actually got scheduled for it) then that's fine and we
     * simply don't need to do anything.
     */
    del234(timer_contexts, ctx);
}